

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

bool __thiscall MemoryManager::copyFrom(MemoryManager *this,void *src,uint32_t dest,uint32_t len)

{
  uint8_t **ppuVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = len == 0;
  if (!bVar3) {
    ppuVar1 = this->memory[dest >> 0x16];
    if (ppuVar1 != (uint8_t **)0x0) {
      uVar2 = 1;
      do {
        if (*(long *)((long)ppuVar1 + (ulong)(dest >> 9 & 0x1ff8)) == 0) break;
        setByte(this,dest,*(uint8_t *)((long)src + (uVar2 - 1)),(uint32_t *)0x0);
        bVar3 = len <= uVar2;
        if (uVar2 == len) {
          return bVar3;
        }
        dest = dest + 1;
        ppuVar1 = this->memory[dest >> 0x16];
        uVar2 = uVar2 + 1;
      } while (ppuVar1 != (uint8_t **)0x0);
    }
    dbgprintf("Data copy to invalid addr 0x%x!\n",(ulong)dest);
  }
  return bVar3;
}

Assistant:

bool MemoryManager::copyFrom(const void *src, uint32_t dest, uint32_t len) {
  for (uint32_t i = 0; i < len; ++i) {
    if (!this->isAddrExist(dest + i)) {
      dbgprintf("Data copy to invalid addr 0x%x!\n", dest + i);
      return false;
    }
    this->setByte(dest + i, ((uint8_t *)src)[i]);
  }
  return true;
}